

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O2

ProgramBinary *
vk::anon_unknown_8::createProgramBinaryFromSpirV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  pointer binary_00;
  ProgramBinary *this;
  
  this = (ProgramBinary *)operator_new(0x20);
  binary_00 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  ProgramBinary::ProgramBinary
            (this,PROGRAM_FORMAT_SPIRV,
             (long)(binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)binary_00,(deUint8 *)binary_00);
  return this;
}

Assistant:

ProgramBinary* createProgramBinaryFromSpirV (const vector<deUint32>& binary)
{
	DE_ASSERT(!binary.empty());

	if (isNativeSpirVBinaryEndianness())
		return new ProgramBinary(PROGRAM_FORMAT_SPIRV, binary.size()*sizeof(deUint32), (const deUint8*)&binary[0]);
	else
		TCU_THROW(InternalError, "SPIR-V endianness translation not supported");
}